

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

Vec4 __thiscall tcu::linearToSRGB(tcu *this,Vec4 *cl)

{
  float fVar1;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  ulong uVar3;
  float fVar4;
  Vec4 VVar5;
  
  fVar2 = cl->m_data[0];
  fVar4 = 0.0;
  if (0.0 < fVar2) {
    if (0.0031308 <= fVar2) {
      fVar4 = 1.0;
      if (fVar2 < 1.0) {
        fVar2 = powf(fVar2,0.41666);
        fVar4 = fVar2 * 1.055 + -0.055;
      }
    }
    else {
      fVar4 = fVar2 * 12.92;
    }
  }
  fVar1 = 0.0;
  fVar2 = cl->m_data[1];
  if (0.0 < fVar2) {
    if (0.0031308 <= fVar2) {
      fVar1 = 1.0;
      if (fVar2 < 1.0) {
        fVar2 = powf(fVar2,0.41666);
        fVar1 = fVar2 * 1.055 + -0.055;
      }
    }
    else {
      fVar1 = fVar2 * 12.92;
    }
  }
  fVar2 = cl->m_data[2];
  uVar3 = 0;
  if (0.0 < fVar2) {
    if (0.0031308 <= fVar2) {
      uVar3 = 0x3f800000;
      if (fVar2 < 1.0) {
        fVar2 = powf(fVar2,0.41666);
        uVar3 = CONCAT44(extraout_XMM0_Db,fVar2 * 1.055 + -0.055);
      }
    }
    else {
      uVar3 = (ulong)(uint)(fVar2 * 12.92);
    }
  }
  fVar2 = cl->m_data[3];
  VVar5.m_data[1] = 0.0;
  VVar5.m_data[0] = fVar2;
  *(float *)this = fVar4;
  *(float *)(this + 4) = fVar1;
  *(int *)(this + 8) = (int)uVar3;
  *(float *)(this + 0xc) = fVar2;
  VVar5.m_data[2] = (float)(int)uVar3;
  VVar5.m_data[3] = (float)(int)(uVar3 >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

Vec4 linearToSRGB (const Vec4& cl)
{
	return Vec4(linearChannelToSRGB(cl[0]),
				linearChannelToSRGB(cl[1]),
				linearChannelToSRGB(cl[2]),
				cl[3]);
}